

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O3

void lf::assemble::test::linfe_mat_assembly(Mesh *mesh,DofHandler *dof_handler)

{
  long lVar1;
  undefined8 uVar2;
  pointer pTVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong col;
  size_type N_dofs;
  Matrix<double,__1,_1,_0,__1,_1> rhsvec;
  TestVectorAssembler vec_assembler;
  SparseMatrix<double,_0,_int> Galerkin_matrix;
  MatrixXd ref_mat;
  MatrixXd dense_Gal_mat;
  TestAssembler assembler;
  uint local_504;
  undefined1 local_500 [16];
  AssertHelper local_4f0;
  _Alloc_hider local_4e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  pointer pTStack_4c8;
  pointer local_4c0;
  undefined1 local_4b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  Mesh *local_498;
  void *local_488;
  iterator iStack_480;
  uint *local_478;
  Mesh *local_468;
  double local_460;
  AssertHelper local_458;
  undefined1 local_450 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  pointer pTStack_440;
  pointer local_438;
  StorageIndex *local_430;
  CompressedStorage<double,_int> local_428;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_408;
  DofHandler *local_3e8;
  void *local_3e0 [3];
  undefined1 local_3c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8 [7];
  Mesh *local_348;
  Scalar local_330;
  Scalar local_328;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  Scalar local_308;
  Scalar local_300;
  Scalar local_2f8;
  Scalar local_2f0;
  Scalar local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  Scalar local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  Scalar local_288;
  undefined1 *local_280;
  Scalar local_278;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  Scalar local_230;
  Scalar local_228;
  Scalar local_220;
  Scalar local_218;
  Scalar local_210;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  Scalar local_1e8;
  Scalar local_1e0;
  Scalar local_1d8;
  Scalar local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  Scalar local_1b8;
  Scalar local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  Scalar local_198;
  Scalar local_190;
  Scalar local_188;
  Scalar local_180;
  Scalar local_178;
  Scalar local_170;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  undefined1 *local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  long *plVar8;
  
  local_468 = mesh;
  local_504 = (*dof_handler->_vptr_DofHandler[2])(dof_handler);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," degrees of freedom built",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_450._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_3c8,"N_dofs","10",&local_504,(int *)local_450);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_450._4_4_,local_450._0_4_) + 0x10),
               "Dubious numbers of dofs",0x17);
    if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_3c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
               ,0xe0,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4b8,(Message *)local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4b8);
    if ((long *)CONCAT44(local_450._4_4_,local_450._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_450._4_4_,local_450._0_4_) + 8))();
    }
  }
  if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,local_3c0);
  }
  local_488 = (void *)0x0;
  iStack_480._M_current = (uint *)0x0;
  local_478 = (uint *)0x0;
  if (local_504 == 0) {
    uVar6 = 0;
  }
  else {
    uVar14 = 0;
    do {
      iVar5 = (*dof_handler->_vptr_DofHandler[7])(dof_handler,uVar14);
      plVar8 = (long *)CONCAT44(extraout_var,iVar5);
      uVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
      local_3c8[0] = (internal)uVar4;
      local_4b8[0] = kPoint;
      testing::internal::CmpHelperEQ<lf::base::RefEl,lf::base::RefEl>
                ((internal *)local_450,"e.RefEl()","lf::base::RefEl::kPoint()",(RefEl *)local_3c8,
                 (RefEl *)local_4b8);
      if (local_450[0] == false) {
        testing::Message::Message((Message *)local_4b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_4b8._1_7_,local_4b8[0]) + 0x10),"dofs @ ",7);
        uVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
        local_4d8._M_local_buf[0] = uVar4;
        lVar1 = CONCAT71(local_4b8._1_7_,local_4b8[0]);
        base::RefEl::ToString_abi_cxx11_((string *)local_3c8,(RefEl *)local_4d8._M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(lVar1 + 0x10),(char *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_),
                   (long)local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) != local_3b8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_),
                          local_3b8[0]._M_allocated_capacity + 1);
        }
        pcVar13 = "";
        if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar13 = (local_448->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_3c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                   ,0xe6,pcVar13);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)local_4b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
        if ((long *)CONCAT71(local_4b8._1_7_,local_4b8[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_4b8._1_7_,local_4b8[0]) + 8))();
        }
      }
      if (local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_448,local_448);
      }
      local_3c8._0_4_ = (*local_468->_vptr_Mesh[5])(local_468,plVar8);
      if (iStack_480._M_current == local_478) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_488,iStack_480,
                   (uint *)local_3c8);
      }
      else {
        *iStack_480._M_current = local_3c8._0_4_;
        iStack_480._M_current = iStack_480._M_current + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dof ",4);
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," @node ",7);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      uVar14 = uVar14 + 1;
      uVar6 = local_504;
    } while (uVar14 < local_504);
  }
  local_348 = local_468;
  local_4d8._M_allocated_capacity._4_4_ = uVar6;
  local_4d8._M_allocated_capacity._0_4_ = uVar6;
  local_4d8._8_8_ = (void *)0x0;
  pTStack_4c8 = (pointer)0x0;
  local_4c0 = (pointer)0x0;
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::assemble::test::TestAssembler>
            ((COOMatrix<double> *)local_450,0,dof_handler,dof_handler,(TestAssembler *)local_3c8);
  pTVar3 = local_4c0;
  uVar2 = local_4d8._8_8_;
  local_4d8._M_allocated_capacity = CONCAT44(local_450._4_4_,local_450._0_4_);
  local_4d8._8_8_ = local_448;
  pTStack_4c8 = pTStack_440;
  local_4c0 = local_438;
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pTStack_440 = (pointer)0x0;
  local_438 = (pointer)0x0;
  if (((void *)uVar2 != (void *)0x0) &&
     (operator_delete((void *)uVar2,(long)pTVar3 - uVar2),
     local_448 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    operator_delete(local_448,(long)local_438 - (long)local_448);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Assembled ",10);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," matrix",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)local_450,(COOMatrix<double> *)&local_4d8);
  poVar7 = Eigen::operator<<((ostream *)&std::cout,(SparseMatrix<double,_0,_int> *)local_450);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::SparseMatrix<double,0,int>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3e0,
             (EigenBase<Eigen::SparseMatrix<double,_0,_int>_> *)local_450);
  local_408.m_storage.m_data = (double *)0x0;
  local_408.m_storage.m_rows = 0;
  local_408.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_408,10,10);
  local_500._0_8_ = &DAT_403a000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4b8,
             (Matrix<double,__1,__1,_0,__1,__1> *)&local_408,(Scalar *)local_500);
  local_4f0.data_ = (AssertHelperData *)0xc02a000000000000;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4b8,
                      (Scalar *)&local_4f0);
  local_4e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_c02c000000000000;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,(Scalar *)&local_4e0);
  local_458.data_ = (AssertHelperData *)0xc014000000000000;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,(Scalar *)&local_458);
  local_38 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_38);
  local_40 = 0.0;
  local_3e8 = dof_handler;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_40);
  local_48 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_48);
  local_50 = -13.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_50);
  local_58 = -7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_58);
  local_60 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_60);
  local_68 = -13.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_68);
  local_70 = 16.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_70);
  local_78 = -10.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_78);
  local_80 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_80);
  local_88 = -3.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_88);
  local_90 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_90);
  local_98 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_98);
  local_a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_a0);
  local_a8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_a8);
  local_b0 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_b0);
  local_b8 = &DAT_c02c000000000000;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,(Scalar *)&local_b8);
  local_c0 = -10.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_c0);
  local_c8 = 23.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_c8);
  local_d0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_d0);
  local_d8 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_d8);
  local_e0 = -7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_e0);
  local_e8 = -10.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_e8);
  local_f0 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_f0);
  local_f8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_f8);
  local_100 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_100);
  local_108 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_108);
  local_110 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_110);
  local_118 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_118);
  local_120 = 6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_120);
  local_128 = -1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_128);
  local_130 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_130);
  local_138 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_138);
  local_140 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_140);
  local_148 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_148);
  local_150 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_150);
  local_158 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_158);
  local_160 = -3.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_160);
  local_168 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_168);
  local_170 = -1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_170);
  local_178 = 6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_178);
  local_180 = -3.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_180);
  local_188 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_188);
  local_190 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_190);
  local_198 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_198);
  local_1a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1a0);
  local_1a8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1a8);
  local_1b0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1b0);
  local_1b8 = -7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1b8);
  local_1c0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1c0);
  local_1c8 = -3.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1c8);
  local_1d0 = 7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1d0);
  local_1d8 = -4.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1d8);
  local_1e0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1e0);
  local_1e8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1e8);
  local_1f0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1f0);
  local_1f8 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_1f8);
  local_200 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_200);
  local_208 = -10.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_208);
  local_210 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_210);
  local_218 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_218);
  local_220 = -4.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_220);
  local_228 = 10.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_228);
  local_230 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_230);
  local_238 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_238);
  local_240 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_240);
  local_248 = -13.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_248);
  local_250 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_250);
  local_258 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_258);
  local_260 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_260);
  local_268 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_268);
  local_270 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_270);
  local_278 = -6.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_278);
  local_280 = &DAT_402a000000000000;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,(Scalar *)&local_280);
  local_288 = -7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_288);
  local_290 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_290);
  local_298 = -7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_298);
  local_2a0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2a0);
  local_2a8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2a8);
  local_2b0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2b0);
  local_2b8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2b8);
  local_2c0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2c0);
  local_2c8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2c8);
  local_2d0 = -7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2d0);
  local_2d8 = 7.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2d8);
  local_2e0 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2e0);
  local_2e8 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2e8);
  local_2f0 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2f0);
  local_2f8 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_2f8);
  local_300 = -5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_300);
  local_308 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_308);
  local_310 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_310);
  local_318 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_318);
  local_320 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_320);
  local_328 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar9,&local_328);
  local_330 = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_330);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4b8);
  if (local_504 != 0) {
    uVar14 = 1;
    uVar12 = 0;
    do {
      iVar5 = (int)uVar14;
      uVar14 = 0;
      if (iVar5 != 0) {
        col = 0;
        do {
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                               local_3e0,uVar12,col);
          local_460 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                               &local_408,(ulong)*(uint *)((long)local_488 + uVar12 * 4),
                               (ulong)*(uint *)((long)local_488 + col * 4));
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)local_4b8,"dense_Gal_mat(i, j)",
                     "ref_mat(dof_to_entity_index[i], dof_to_entity_index[j])",local_460,*pSVar10);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_500);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_500._0_8_ + 0x10)," mismatch in entry (",0x14);
            std::ostream::operator<<
                      ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_500._0_8_ + 0x10),(int)uVar12);
            local_4f0.data_._0_1_ =
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_500._0_8_ + 0x10),(char *)&local_4f0,1);
            std::ostream::operator<<
                      ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_500._0_8_ + 0x10),(int)col);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_500._0_8_ + 0x10),")",1);
            pcVar13 = "";
            if (local_4b0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar13 = (local_4b0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_4f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                       ,0x10a,pcVar13);
            testing::internal::AssertHelper::operator=(&local_4f0,(Message *)local_500);
            testing::internal::AssertHelper::~AssertHelper(&local_4f0);
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_500._0_8_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_500._0_8_ + 8))();
            }
          }
          if (local_4b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,local_4b0);
          }
          col = col + 1;
          uVar14 = (ulong)local_504;
        } while (col < uVar14);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar14);
  }
  local_498 = local_468;
  AssembleVectorLocally<Eigen::Matrix<double,_1,1,0,_1,1>,lf::assemble::test::TestVectorAssembler>
            ((assemble *)local_500,0,local_3e8,(TestVectorAssembler *)local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Assembled vector: ",0x12);
  local_4f0.data_ = (AssertHelperData *)local_500;
  poVar7 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)&local_4f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_504 != 0) {
    uVar14 = 0;
    do {
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_500,
                           uVar14);
      local_460 = *pSVar11;
      uVar12 = (ulong)*(uint *)((long)local_488 + uVar14 * 4);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                           &local_408,uVar12,uVar12);
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)&local_4f0,"rhsvec[i]",
                 "ref_mat(dof_to_entity_index[i], dof_to_entity_index[i])",local_460,*pSVar10);
      if (local_4f0.data_._0_1_ ==
          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)0x0) {
        testing::Message::Message((Message *)&local_4e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4e0._M_head_impl + 0x10)," mismatch in component ",0x17);
        std::ostream::operator<<(local_4e0._M_head_impl + 0x10,(int)uVar14);
        pcVar13 = "";
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar13 = *(char **)local_4e8._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_458,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                   ,0x11b,pcVar13);
        testing::internal::AssertHelper::operator=(&local_458,(Message *)&local_4e0);
        testing::internal::AssertHelper::~AssertHelper(&local_458);
        if (local_4e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4e0._M_head_impl + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_4e8._M_p);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_504);
  }
  free((void *)local_500._0_8_);
  free(local_408.m_storage.m_data);
  free(local_3e0[0]);
  free(local_438);
  free(local_430);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_428);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_4d8._8_8_,(long)local_4c0 - local_4d8._8_8_);
  }
  if (local_488 != (void *)0x0) {
    operator_delete(local_488,(long)local_478 - (long)local_488);
  }
  return;
}

Assistant:

void linfe_mat_assembly(const lf::mesh::Mesh &mesh,
                        const lf::assemble::DofHandler &dof_handler) {
  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());

  std::cout << N_dofs << " degrees of freedom built" << std::endl;
  EXPECT_EQ(N_dofs, 10) << "Dubious numbers of dofs";

  // Output/store index numbers of entities holding global shape functions
  std::vector<lf::base::glb_idx_t> dof_to_entity_index{};
  for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
    const lf::mesh::Entity &e(dof_handler.Entity(dof_idx));
    EXPECT_EQ(e.RefEl(), lf::base::RefEl::kPoint()) << "dofs @ " << e.RefEl();
    const lf::base::glb_idx_t e_idx(mesh.Index(e));
    dof_to_entity_index.push_back(e_idx);
    std::cout << "dof " << dof_idx << " @node " << e_idx << std::endl;
  }

  // Dummy assembler
  TestAssembler assembler{mesh};
  lf::assemble::COOMatrix<double> mat(N_dofs, N_dofs);

  mat = lf::assemble::AssembleMatrixLocally<lf::assemble::COOMatrix<double>>(
      0, dof_handler, assembler);

  std::cout << "Assembled " << mat.rows() << "x" << mat.cols() << " matrix"
            << std::endl;

  // Build sparse matrix from COO format
  Eigen::SparseMatrix<double> Galerkin_matrix = mat.makeSparse();

  // Output Galerkin matrix
  std::cout << Galerkin_matrix << std::endl;

  // Convert Galerkin matrix to a dense matrix
  Eigen::MatrixXd dense_Gal_mat = Galerkin_matrix;

  // Reference Galerkin matrix
  Eigen::MatrixXd ref_mat(10, 10);
  ref_mat << 26, -13, -14, -5, 0, 0, -6, -13, -7, -5, -13, 16, -10, -6, -3, 0,
      0, 0, 0, -5, -14, -10, 23, 0, -5, -7, -10, -6, 0, 0, -5, -6, 0, 6, -1, 0,
      0, 0, 0, -5, 0, -3, -5, -1, 6, -3, 0, 0, 0, 0, 0, 0, -7, 0, -3, 7, -4, 0,
      0, 0, -6, 0, -10, 0, 0, -4, 10, -6, 0, 0, -13, 0, -6, 0, 0, 0, -6, 13, -7,
      0, -7, 0, 0, 0, 0, 0, 0, -7, 7, -0, -5, -5, 0, -5, 0, 0, 0, 0, -0, 5;

  for (int i = 0; i < N_dofs; ++i) {
    for (int j = 0; j < N_dofs; ++j) {
      EXPECT_DOUBLE_EQ(dense_Gal_mat(i, j),
                       ref_mat(dof_to_entity_index[i], dof_to_entity_index[j]))
          << " mismatch in entry (" << i << ',' << j << ")";
    }
  }

  // test vector assembler
  TestVectorAssembler vec_assembler{mesh};

  // The actual assembly is done here
  auto rhsvec = lf::assemble::AssembleVectorLocally<Eigen::VectorXd>(
      0, dof_handler, vec_assembler);

  // Output assembled vector
  std::cout << "Assembled vector: " << rhsvec.transpose() << std::endl;

  for (int i = 0; i < N_dofs; ++i) {
    EXPECT_DOUBLE_EQ(rhsvec[i],
                     ref_mat(dof_to_entity_index[i], dof_to_entity_index[i]))
        << " mismatch in component " << i;
  }
}